

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

ssize_t __thiscall session::send(session *this,int __fd,void *__buf,size_t __n,int __flags)

{
  byte bVar1;
  ssize_t extraout_RAX;
  uint uVar2;
  undefined4 in_register_00000034;
  size_t sVar3;
  ulong uVar4;
  char head_data [16];
  iovec iov [2];
  undefined8 uStack_40;
  byte local_38 [16];
  iovec local_28;
  undefined8 local_18;
  long local_10;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  local_28.iov_base = local_38;
  uVar2 = (uint)__buf;
  if ((int)uVar2 < 0) {
    local_28.iov_len = 0xffffffffffffffff;
  }
  else if (uVar2 < 0x80) {
    local_28.iov_len = 1;
    local_38[0] = (byte)__buf;
  }
  else {
    local_28.iov_len = 2;
    if (((0x7ff < uVar2) && (local_28.iov_len = 3, 0xffff < uVar2)) &&
       (local_28.iov_len = 4, 0x1fffff < uVar2)) {
      local_28.iov_len = 6 - (ulong)(uVar2 < 0x4000000);
    }
    bVar1 = 0x80;
    uVar4 = (ulong)__buf & 0xffffffff;
    sVar3 = local_28.iov_len;
    do {
      local_38[sVar3 - 1] = (byte)uVar4 & 0x3f | 0x80;
      bVar1 = bVar1 >> 1 | bVar1;
      uVar4 = uVar4 >> 6;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
    local_38[0] = bVar1 * '\x02' | local_38[0];
  }
  local_10 = (long)(int)uVar2;
  uStack_40 = 0x107bc6;
  transmit(this,&local_28,2);
  return extraout_RAX;
}

Assistant:

void session::send(const void* data, int len)
{
    char head_data[16];
    int head_len = encode_head(head_data, sizeof(head_data), len);
    iovec iov[2];
    iov[0].iov_base = head_data;
    iov[0].iov_len = head_len;
    iov[1].iov_base = (char*)data;
    iov[1].iov_len = len;
    transmit(iov, 2);
}